

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.h
# Opt level: O2

void __thiscall QTable::QTable(QTable *this,QTable *a)

{
  *(undefined ***)this = &PTR___cxa_pure_virtual_00107d28;
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)(this + 8),
           (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)(a + 8));
  *(code **)this = std::operator<<;
  return;
}

Assistant:

QTable(const QTable& a)
        :   matrix_t(a)
        {}